

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

bool slang::ast::checkSignaturesMatch(SubroutineSymbol *a,SubroutineSymbol *b)

{
  pointer ppFVar1;
  size_t sVar2;
  pointer ppFVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  Type *pTVar7;
  Type *pTVar8;
  long lVar9;
  
  if ((a->subroutineKind == b->subroutineKind) && ((a->flags).m_bits == (b->flags).m_bits)) {
    pTVar7 = DeclaredType::getType(&a->declaredReturnType);
    pTVar8 = DeclaredType::getType(&b->declaredReturnType);
    bVar6 = Type::isEquivalent(pTVar7,pTVar8);
    if (bVar6) {
      if ((a->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&a->super_Scope);
      }
      ppFVar1 = (a->arguments)._M_ptr;
      sVar2 = (a->arguments)._M_extent._M_extent_value;
      if ((b->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&b->super_Scope);
      }
      if (sVar2 == (b->arguments)._M_extent._M_extent_value) {
        if (sVar2 == 0) {
          return true;
        }
        ppFVar3 = (b->arguments)._M_ptr;
        lVar9 = 0;
        while( true ) {
          lVar4 = *(long *)((long)ppFVar1 + lVar9);
          lVar5 = *(long *)((long)ppFVar3 + lVar9);
          pTVar7 = DeclaredType::getType((DeclaredType *)(lVar4 + 0x40));
          pTVar8 = DeclaredType::getType((DeclaredType *)(lVar5 + 0x40));
          bVar6 = Type::isEquivalent(pTVar7,pTVar8);
          if ((!bVar6) || (*(int *)(lVar4 + 0x158) != *(int *)(lVar5 + 0x158))) break;
          lVar9 = lVar9 + 8;
          if (sVar2 << 3 == lVar9) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool checkSignaturesMatch(const SubroutineSymbol& a, const SubroutineSymbol& b) {
    if (a.subroutineKind != b.subroutineKind || a.flags != b.flags)
        return false;

    if (!a.getReturnType().isEquivalent(b.getReturnType()))
        return false;

    auto aargs = a.getArguments();
    auto bargs = b.getArguments();
    if (aargs.size() != bargs.size())
        return false;

    for (auto ai = aargs.begin(), bi = bargs.begin(); ai != aargs.end(); ai++, bi++) {
        auto aa = *ai;
        auto bb = *bi;
        if (!aa->getType().isEquivalent(bb->getType()))
            return false;
        if (aa->direction != bb->direction)
            return false;
    }

    return true;
}